

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O0

void Am_Text_Start_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  bool bVar1;
  Am_Value_Type in_id;
  Am_ID_Tag AVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object owner;
  Am_Object local_70;
  int local_68;
  int local_64;
  int y;
  int x;
  Am_Inter_Location data;
  Am_Object local_48;
  Am_Object command_obj;
  Am_Inter_Internal_Method inter_method;
  int real_run;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  pAVar4 = Am_Object::Get(inter,300,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar3 == 1) {
    Am_Object::Set(inter,0x11c,true,0);
  }
  else if (iVar3 == 0) {
    Am_Object::Set(inter,0x11c,false,0);
  }
  Am_Object::Set(inter,300,3,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(object);
  Am_Object::Set(inter,0x16d,pAVar5,0);
  bVar1 = Am_Check_Inter_Abort_Inactive_Object(object,0x15c,inter);
  if (bVar1) {
    Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)&command_obj);
    pAVar4 = Am_Object::Get(&Am_Interactor,0xbe,0);
    Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&command_obj,pAVar4);
    (*(code *)inter_method.from_wrapper)(inter,object,event_window,ev);
    Am_Object::Am_Object(&local_48);
    pAVar4 = Am_Object::Get(inter,0xc5,0);
    Am_Object::operator=(&local_48,pAVar4);
    set_initial_text_values(inter,&local_48,object,ev->x,ev->y);
    Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&y,&Am_No_Location);
    local_64 = ev->x;
    local_68 = ev->y;
    Am_Object::Am_Object(&local_70,&Am_Text_Create_Interactor);
    bVar1 = Am_Object::Is_Instance_Of(inter,&local_70);
    Am_Object::~Am_Object(&local_70);
    if (bVar1) {
      in_id = Am_Object::Get_Slot_Type(inter,0x16a,0);
      AVar2 = Am_Type_Class(in_id);
      if (AVar2 == 0x2000) {
        Am_Object::Make_Unique(inter,0x16a);
        pAVar4 = Am_Object::Get(inter,0x16a,0);
        Am_Inter_Location::operator=((Am_Inter_Location *)&y,pAVar4);
      }
      else {
        Am_Object::Am_Object(&owner,&Am_No_Object);
        Am_Inter_Location::Set_Location((Am_Inter_Location *)&y,false,&owner,0,0,0,0,true);
        Am_Object::~Am_Object(&owner);
        pAVar5 = Am_Inter_Location::operator_cast_to_Am_Wrapper_((Am_Inter_Location *)&y);
        Am_Object::Set(inter,0x16a,pAVar5,0);
      }
      Am_Object::Get_Owner(&local_80,(Am_Slot_Flags)inter);
      bVar1 = Am_Object::Valid(&local_80);
      if (bVar1) {
        Am_Translate_Coordinates(event_window,local_64,local_68,&local_80,&local_64,&local_68);
      }
      else {
        Am_Object::operator=(&local_80,event_window);
      }
      Am_Object::Am_Object(&local_88,inter);
      Am_Get_Filtered_Input(&local_88,&local_80,local_64,local_68,&local_64,&local_68);
      Am_Object::~Am_Object(&local_88);
      Am_Object::Am_Object(&local_90,&local_80);
      Am_Inter_Location::Set_Location
                ((Am_Inter_Location *)&y,false,&local_90,local_64,local_68,0,0,false);
      Am_Object::~Am_Object(&local_90);
      Am_Inter_Location::Set_Growing((Am_Inter_Location *)&y,false,true);
      Am_Object::~Am_Object(&local_80);
    }
    Am_Inter_Call_Both_Method
              (inter,&local_48,199,local_64,local_68,event_window,&ev->input_char,object,
               (Am_Inter_Location *)&y);
    Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&y);
    Am_Object::~Am_Object(&local_48);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Text_Start_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Text starting over " << object);

  // in case last time ran, stopped because pressed outside
  int real_run = inter.Get(Am_REAL_RUN_ALSO);
  if (real_run == 1)
    inter.Set(Am_RUN_ALSO, true);
  else if (real_run == 0)
    inter.Set(Am_RUN_ALSO, false);
  inter.Set(Am_REAL_RUN_ALSO, 3);

  inter.Set(Am_OBJECT_MODIFIED, object);
  //do this before prototype's method, so won't even change state
  if (!Am_Check_Inter_Abort_Inactive_Object(object, Am_TEXT_EDIT_INACTIVE,
                                            inter))
    return;

  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_START_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  set_initial_text_values(inter, command_obj, object, ev->x, ev->y);

  Am_Inter_Location data = Am_No_Location;
  int x = ev->x;
  int y = ev->y;
  if (inter.Is_Instance_Of(Am_Text_Create_Interactor)) {
    if (Am_Type_Class(inter.Get_Slot_Type(Am_INTERIM_VALUE)) == Am_WRAPPER) {
      inter.Make_Unique(Am_INTERIM_VALUE);
      data = inter.Get(Am_INTERIM_VALUE);
    } else {
      //set up with some temporary values
      data.Set_Location(false, Am_No_Object, 0, 0, 0, 0);
      inter.Set(Am_INTERIM_VALUE, data);
    }
    Am_Object owner = inter.Get_Owner();
    if (owner.Valid()) {
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                           "Translating coordinates from " << event_window
                                                           << " to " << owner);
      Am_Translate_Coordinates(event_window, x, y, owner, x, y);
    } else
      owner = event_window;
    Am_Get_Filtered_Input(inter, owner, x, y, x, y);
    data.Set_Location(false, owner, x, y, 0, 0, false);
    data.Set_Growing(false);
  }
  Am_Inter_Call_Both_Method(inter, command_obj, Am_START_DO_METHOD, x, y,
                            event_window, ev->input_char, object, data);
}